

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMan.c
# Opt level: O0

void Cut_ManStop(Cut_Man_t *p)

{
  Cut_Man_t *p_local;
  
  if (p->vCutsNew != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCutsNew);
  }
  if (p->vCutsOld != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCutsOld);
  }
  if (p->vCutsTemp != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCutsTemp);
  }
  if (p->vFanCounts != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vFanCounts);
  }
  if (p->vTemp != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vTemp);
  }
  if (p->vCutsMax != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCutsMax);
  }
  if (p->vDelays != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vDelays);
  }
  if (p->vDelays2 != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vDelays2);
  }
  if (p->vNodeCuts != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vNodeCuts);
  }
  if (p->vNodeStarts != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vNodeStarts);
  }
  if (p->vCutPairs != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vCutPairs);
  }
  if ((p->puTemp[0] != (uint *)0x0) && (p->puTemp[0] != (uint *)0x0)) {
    free(p->puTemp[0]);
    p->puTemp[0] = (uint *)0x0;
  }
  Extra_MmFixedStop(p->pMmCuts);
  if (p != (Cut_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Cut_ManStop( Cut_Man_t * p )
{
    if ( p->vCutsNew )    Vec_PtrFree( p->vCutsNew );
    if ( p->vCutsOld )    Vec_PtrFree( p->vCutsOld );
    if ( p->vCutsTemp )   Vec_PtrFree( p->vCutsTemp );
    if ( p->vFanCounts )  Vec_IntFree( p->vFanCounts );
    if ( p->vTemp )       Vec_PtrFree( p->vTemp );

    if ( p->vCutsMax )    Vec_PtrFree( p->vCutsMax );
    if ( p->vDelays )     Vec_IntFree( p->vDelays );
    if ( p->vDelays2 )    Vec_IntFree( p->vDelays2 );
    if ( p->vNodeCuts )   Vec_IntFree( p->vNodeCuts );
    if ( p->vNodeStarts ) Vec_IntFree( p->vNodeStarts );
    if ( p->vCutPairs )   Vec_IntFree( p->vCutPairs );
    if ( p->puTemp[0] )   ABC_FREE( p->puTemp[0] );

    Extra_MmFixedStop( p->pMmCuts );
    ABC_FREE( p );
}